

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O3

void * funchook_resolve_func(funchook_t *funchook,void *func)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  ulong *puVar5;
  uint *puVar6;
  ulong *puVar7;
  ulong *puVar8;
  uint *puVar9;
  
  if (_mmap != (ulong *)0x0) {
    puVar5 = _mmap;
    puVar7 = (ulong *)0x0;
    do {
      puVar8 = puVar7;
      if ((((void *)*puVar5 <= func) && (puVar8 = puVar5, puVar7 != (ulong *)0x0)) &&
         (puVar8 = puVar7, (void *)*puVar5 < (void *)*puVar7)) {
        puVar8 = puVar5;
      }
      puVar5 = (ulong *)puVar5[3];
      puVar7 = puVar8;
    } while (puVar5 != (ulong *)0x0);
    if (puVar8 != (ulong *)0x0) {
      piVar1 = (int *)*puVar8;
      if (piVar1 == (int *)0x0) {
LAB_00102707:
        puVar6 = (uint *)0x0;
        funchook_log(funchook,"  link_map addr=%p, name=%s\n",piVar1,puVar8[1]);
        puVar5 = (ulong *)(puVar8[2] + 8);
        puVar9 = (uint *)0x0;
        uVar3 = 0;
        do {
          uVar2 = puVar5[-1];
          if ((long)uVar2 < 6) {
            if (uVar2 == 5) {
              puVar9 = (uint *)*puVar5;
            }
            else if (uVar2 == 0) {
              while( true ) {
                if (puVar9 <= puVar6) {
                  return func;
                }
                if (uVar3 <= *puVar6) break;
                if ((((puVar6[1] & 0xf) == 2) && (*(long *)(puVar6 + 4) == 0)) &&
                   (*(void **)(puVar6 + 2) == func)) {
                  pvVar4 = (void *)dlsym(0,(ulong)*puVar6 + (long)puVar9);
                  if (pvVar4 == func) {
                    pvVar4 = (void *)dlsym(0xffffffffffffffff,(ulong)*puVar6 + (long)puVar9);
                  }
                  if (pvVar4 == (void *)0x0) {
                    return func;
                  }
                  funchook_log(funchook,"  change %s address from %p to %p\n",
                               (long)puVar9 + (ulong)*puVar6,func,pvVar4);
                  return pvVar4;
                }
                puVar6 = puVar6 + 6;
              }
              return func;
            }
          }
          else if (uVar2 == 6) {
            puVar6 = (uint *)*puVar5;
          }
          else if (uVar2 == 10) {
            uVar3 = *puVar5;
          }
          puVar5 = puVar5 + 2;
        } while( true );
      }
      if (*piVar1 == 0x464c457f) {
        if ((*(ushort *)(piVar1 + 4) & 0xfffe) == 2) goto LAB_00102707;
        funchook_log(funchook,"  ELF type is neither ET_EXEC nor ET_DYN.\n");
      }
      else {
        funchook_log(funchook,"  not a valid ELF module %s.\n",puVar8[1]);
      }
    }
  }
  return func;
}

Assistant:

void *funchook_resolve_func(funchook_t *funchook, void *func)
{
#ifdef __GLIBC__
    struct link_map *lmap, *lm;
    const ElfW(Ehdr) *ehdr;
    const ElfW(Dyn) *dyn;
    const ElfW(Sym) *symtab = NULL;
    const ElfW(Sym) *symtab_end = NULL;
    const char *strtab = NULL;
    size_t strtab_size = 0;
    int i;

    lmap = NULL;
    for (lm = _r_debug.r_map; lm != NULL; lm = lm->l_next) {
        if ((void*)lm->l_addr <= func) {
            if (lmap == NULL) {
                lmap = lm;
            } else if (lmap->l_addr > lm->l_addr) {
                lmap = lm;
            }
        }
    }
    if (lmap == NULL) {
        return func;
    }
    if (lmap->l_addr != 0) {
        ehdr = (ElfW(Ehdr) *)lmap->l_addr;
        if (memcmp(ehdr->e_ident, ELFMAG, SELFMAG) != 0) {
            funchook_log(funchook, "  not a valid ELF module %s.\n", lmap->l_name);
            return func;
        }
        if (ehdr->e_type != ET_EXEC && ehdr->e_type != ET_DYN) {
          funchook_log(funchook, "  ELF type is neither ET_EXEC nor ET_DYN.\n");
          return func;
        }
    }
    funchook_log(funchook, "  link_map addr=%p, name=%s\n", (void*)lmap->l_addr, lmap->l_name);
    dyn = lmap->l_ld;

    for (i = 0; dyn[i].d_tag != DT_NULL; i++) {
        switch (dyn[i].d_tag) {
        case DT_SYMTAB:
            symtab = (const ElfW(Sym) *)dyn[i].d_un.d_ptr;
            break;
        case DT_STRTAB:
            strtab = (const char *)dyn[i].d_un.d_ptr;
            break;
        case DT_STRSZ:
            strtab_size = dyn[i].d_un.d_val;
            break;
        }
    }
    symtab_end = (const ElfW(Sym) *)strtab;
    while (symtab < symtab_end) {
        if (symtab->st_name >= strtab_size) {
            break;
        }
        if (ELF64_ST_TYPE(symtab->st_info) == STT_FUNC &&
            symtab->st_size == 0 && (void*)symtab->st_value == func) {
            void *fn = dlsym(RTLD_DEFAULT, strtab + symtab->st_name);
            if (fn == func) {
                fn = dlsym(RTLD_NEXT, strtab + symtab->st_name);
            }
            if (fn != NULL) {
                funchook_log(funchook, "  change %s address from %p to %p\n",
                             strtab + symtab->st_name, func, fn);
                func = fn;
            }
            break;
        }
        symtab++;
    }
#endif
    return func;
}